

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

void __thiscall
MinVR::VRDataIndex::_setValueSpecialized(VRDataIndex *this,VRDatumPtr *p,VRIntArray *value)

{
  VRDatumIntArray *this_00;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  VRDatumPtr *in_stack_00000070;
  vector<int,_std::allocator<int>_> *inVal;
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>
  *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> local_30;
  
  this_00 = VRDatumPtr::intArrayVal(in_stack_00000070);
  inVal = &local_30;
  std::vector<int,_std::allocator<int>_>::vector(in_RSI,in_RDX);
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>::setValue
            (in_stack_ffffffffffffffc0,inVal);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

void _setValueSpecialized(VRDatumPtr p, VRIntArray value) {
    p.intArrayVal()->setValue(value);
  }